

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAccount.cpp
# Opt level: O0

void __thiscall jbcoin::STAccount::STAccount(STAccount *this,SerialIter *sit,SField *name)

{
  SerialIter local_30;
  SField *name_local;
  SerialIter *sit_local;
  STAccount *this_local;
  
  local_30.used_ = (size_t)name;
  name_local = (SField *)sit;
  sit_local = (SerialIter *)this;
  SerialIter::getVLBuffer(&local_30);
  STAccount(this,name,(Buffer *)&local_30);
  Buffer::~Buffer((Buffer *)&local_30);
  return;
}

Assistant:

STAccount::STAccount (SerialIter& sit, SField const& name)
    : STAccount(name, sit.getVLBuffer())
{
}